

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O0

int32_t parse_init_bfr(Btor2Parser *bfr,Btor2Line *l)

{
  int32_t iVar1;
  Btor2Line *pBVar2;
  long lVar3;
  Btor2Parser *in_RSI;
  Btor2Parser *in_RDI;
  Btor2Line *state;
  int64_t in_stack_00000070;
  int64_t in_stack_00000078;
  Btor2Parser *in_stack_00000080;
  uint32_t in_stack_ffffffffffffffdc;
  Btor2Line *in_stack_ffffffffffffffe0;
  int32_t local_4;
  
  iVar1 = parse_sort_id_bfr(in_RSI,(Btor2Sort *)in_stack_ffffffffffffffe0);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = parse_args(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else if (*(long *)in_RSI[1].error < 0) {
      local_4 = perr_bfr(in_RDI,"invalid negated first argument");
    }
    else {
      pBVar2 = id2line_bfr(in_RDI,*(int64_t *)in_RSI[1].error);
      if (pBVar2->tag == BTOR2_TAG_state) {
        lVar3 = *(long *)(in_RSI[1].error + 8);
        if (lVar3 < 1) {
          lVar3 = -lVar3;
        }
        if (*(long *)in_RSI[1].error < lVar3) {
          local_4 = perr_bfr(in_RDI,"state id must be greater than id of second operand");
        }
        else {
          iVar1 = check_state_init(in_stack_00000080,in_stack_00000078,in_stack_00000070);
          if (iVar1 == 0) {
            local_4 = 0;
          }
          else if (pBVar2->init == 0) {
            pBVar2->init = *(int64_t *)(in_RSI[1].error + 8);
            local_4 = 1;
          }
          else {
            local_4 = perr_bfr(in_RDI,"state %ld initialized twice",pBVar2->id);
          }
        }
      }
      else {
        local_4 = perr_bfr(in_RDI,"expected state as first argument");
      }
    }
  }
  return local_4;
}

Assistant:

static int32_t
parse_init_bfr (Btor2Parser *bfr, Btor2Line *l)
{
  Btor2Line *state;
  if (!parse_sort_id_bfr (bfr, &l->sort)) return 0;
  if (!parse_args (bfr, l, 2)) return 0;
  if (l->args[0] < 0) return perr_bfr (bfr, "invalid negated first argument");
  state = id2line_bfr (bfr, l->args[0]);
  if (state->tag != BTOR2_TAG_state)
    return perr_bfr (bfr, "expected state as first argument");
  if (l->args[0] < labs (l->args[1]))
    return perr_bfr (bfr, "state id must be greater than id of second operand");
  if (!check_state_init (bfr, l->args[0], l->args[1])) return 0;
  if (state->init)
    return perr_bfr (bfr, "state %" PRId64 " initialized twice", state->id);
  state->init = l->args[1];
  return 1;
}